

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

OpCode __thiscall IRBuilderAsmJs::GetSimdOpcode(IRBuilderAsmJs *this,OpCodeAsmJs asmjsOpcode)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  OpCode *pOVar5;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xe6e,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_004be383;
    *puVar4 = 0;
  }
  if ((ushort)(asmjsOpcode - Simd128_End_Extend) < 0xfeb5 &&
      (ushort)(asmjsOpcode - Simd128_End) < 0xffe7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xe70,"(IsSimd128AsmJsOpcode(asmjsOpcode))",
                       "IsSimd128AsmJsOpcode(asmjsOpcode)");
    if (!bVar3) goto LAB_004be383;
    *puVar4 = 0;
  }
  if (asmjsOpcode < Simd128_Ld_I8) {
    pOVar5 = (OpCode *)
             ((ulong)((uint)(ushort)(asmjsOpcode - Simd128_Start) * 2) +
             (long)this->m_simdOpcodesMap);
  }
  else {
    if (0x14c < (ushort)(asmjsOpcode - Simd128_Start_Extend)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0xe77,
                         "(asmjsOpcode >= Js::OpCodeAsmJs::Simd128_Start_Extend && asmjsOpcode <= Js::OpCodeAsmJs::Simd128_End_Extend)"
                         ,
                         "asmjsOpcode >= Js::OpCodeAsmJs::Simd128_Start_Extend && asmjsOpcode <= Js::OpCodeAsmJs::Simd128_End_Extend"
                        );
      if (!bVar3) goto LAB_004be383;
      *puVar4 = 0;
    }
    pOVar5 = this->m_simdOpcodesMap + (ulong)(ushort)(asmjsOpcode - Simd128_Start_Extend) + 0x1b;
  }
  OVar1 = *pOVar5;
  if (0x122 < (ushort)(OVar1 - Simd128_BitSelect_I4) && 0x13 < (ushort)(OVar1 - Simd128_IntsToI4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xe7a,"(IsSimd128Opcode(opcode))","IsSimd128Opcode(opcode)");
    if (!bVar3) {
LAB_004be383:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return OVar1;
}

Assistant:

Js::OpCode IRBuilderAsmJs::GetSimdOpcode(Js::OpCodeAsmJs asmjsOpcode)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Js::OpCode opcode = (Js::OpCode) 0;
    Assert(IsSimd128AsmJsOpcode(asmjsOpcode));
    if (asmjsOpcode <= Js::OpCodeAsmJs::Simd128_End)
    {
        opcode =  m_simdOpcodesMap[(uint32)((Js::OpCodeAsmJs)asmjsOpcode - Js::OpCodeAsmJs::Simd128_Start)];
    }
    else
    {
        Assert(asmjsOpcode >= Js::OpCodeAsmJs::Simd128_Start_Extend && asmjsOpcode <= Js::OpCodeAsmJs::Simd128_End_Extend);
        opcode = m_simdOpcodesMap[(uint32)((Js::OpCodeAsmJs)asmjsOpcode - Js::OpCodeAsmJs::Simd128_Start_Extend) + (uint32)(Js::OpCodeAsmJs::Simd128_End - Js::OpCodeAsmJs::Simd128_Start) + 1];
    }
    Assert(IsSimd128Opcode(opcode));
    return opcode;
}